

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

void Qiniu_Rio_BlkputRet_Assign(Qiniu_Rio_BlkputRet *self,Qiniu_Rio_BlkputRet *ret)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  size_t n3;
  size_t n2;
  size_t n1;
  char *p;
  Qiniu_Rio_BlkputRet *ret_local;
  Qiniu_Rio_BlkputRet *self_local;
  
  n3 = 0;
  Qiniu_Rio_BlkputRet_Cleanup(self);
  memcpy(self,ret,0x30);
  if (ret->ctx != (char *)0x0) {
    sVar1 = strlen(ret->ctx);
    sVar1 = sVar1 + 1;
    sVar2 = strlen(ret->host);
    sVar2 = sVar2 + 1;
    if (ret->checksum != (char *)0x0) {
      sVar3 = strlen(ret->checksum);
      n3 = sVar3 + 1;
    }
    __dest = (char *)malloc(sVar1 + n3 + sVar2);
    memcpy(__dest,ret->ctx,sVar1);
    self->ctx = __dest;
    memcpy(__dest + sVar1,ret->host,sVar2);
    self->host = __dest + sVar1;
    if (n3 != 0) {
      memcpy(__dest + sVar2 + sVar1,ret->checksum,n3);
      self->checksum = __dest + sVar2 + sVar1;
    }
    self->economical = 1;
  }
  return;
}

Assistant:

static void Qiniu_Rio_BlkputRet_Assign(Qiniu_Rio_BlkputRet *self, Qiniu_Rio_BlkputRet *ret)
{
    char *p;
    size_t n1 = 0, n2 = 0, n3 = 0;

    Qiniu_Rio_BlkputRet_Cleanup(self);

    *self = *ret;
    if (ret->ctx == NULL)
    {
        return;
    }

    n1 = strlen(ret->ctx) + 1;
    n3 = strlen(ret->host) + 1;
    if (ret->checksum)
    {
        n2 = strlen(ret->checksum) + 1;
    }

    p = (char *)malloc(n1 + n2 + n3);

    memcpy(p, ret->ctx, n1);
    self->ctx = p;

    memcpy(p + n1, ret->host, n3);
    self->host = p + n1;

    if (n2)
    {
        memcpy(p + n1 + n3, ret->checksum, n2);
        self->checksum = p + n1 + n3;
    }
    self->economical = Qiniu_True;
}